

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddCryptedKey
          (DescriptorScriptPubKeyMan *this,CKeyID *key_id,CPubKey *pubkey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *crypted_key)

{
  size_t sVar1;
  pointer puVar2;
  pointer puVar3;
  mapped_type *pmVar4;
  long lVar5;
  undefined8 *puVar6;
  mapped_type *pmVar7;
  long in_FS_OFFSET;
  byte bVar8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  unique_lock<std::recursive_mutex> local_a0;
  undefined8 local_90 [8];
  uchar local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  
  bVar8 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_a0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_a0);
  sVar1 = (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    memcpy(local_90,pubkey,0x41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,crypted_key);
    pmVar4 = std::
             map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ::operator[](&this->m_map_crypted_keys,key_id);
    puVar6 = local_90;
    pmVar7 = pmVar4;
    for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)(pmVar7->first).vch = *puVar6;
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
      pmVar7 = (mapped_type *)((long)pmVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    (pmVar4->first).vch[0x40] = local_50;
    puVar2 = (pmVar4->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (pmVar4->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pmVar4->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pmVar4->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pmVar4->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return sVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::AddCryptedKey(const CKeyID& key_id, const CPubKey& pubkey, const std::vector<unsigned char>& crypted_key)
{
    LOCK(cs_desc_man);
    if (!m_map_keys.empty()) {
        return false;
    }

    m_map_crypted_keys[key_id] = make_pair(pubkey, crypted_key);
    return true;
}